

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O2

int AF_A_MinotaurChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  DAngle angle;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  AActor *self;
  FState *newstate;
  char *__assertion;
  long lVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  FSoundID local_68;
  FName local_64;
  undefined8 local_60;
  VMValue params [3];
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00547be9;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00547bd9;
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_00547958;
    bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00547be9;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_00547bd9;
LAB_00547958:
    self = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_005479d8;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_00547bd9:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_00547be9;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_00547be9;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_00547bd9;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005479d8:
    bVar2 = DObject::IsKindOf((DObject *)self,AMinotaurFriend::RegistrationInfo.MyClass);
    if (!bVar2) {
      A_Chase(stack,self);
      return 0;
    }
    self->RenderStyle = LegacyRenderStyles[1];
    if ((-1 < *(int *)&self->field_0x49c) && (0x36a < level.maptime - *(int *)&self->field_0x49c)) {
      local_64.Index = 0;
      local_60 = 0;
      angle.Degrees._4_4_ = extraout_XMM0_Db;
      angle.Degrees._0_4_ = extraout_XMM0_Da;
      P_DamageMobj(self,(AActor *)0x0,(AActor *)0x0,1000000,&local_64,0,angle);
      return 0;
    }
    iVar3 = FRandom::operator()(&pr_minotaurchase);
    if (iVar3 < 0x1e) {
      params[0].field_0._8_4_ = 1;
      params[0].field_0.field_3.Type = '\x03';
      params[1].field_0.field_3.Type = '\x03';
      params[2].field_0.field_1.a = (void *)0x0;
      params[2].field_0.field_1.atag = 8;
      params[2].field_0.field_3.Type = '\x03';
      params[0].field_0._0_8_ = self;
      params[1].field_0._0_8_ = self;
      params[1].field_0._8_4_ = params[0].field_0._8_4_;
      VMFrameStack::Call(stack,&A_MinotaurLook_VMPtr->super_VMFunction,params,3,(VMReturn *)0x0,0,
                         (VMException **)0x0);
      lVar5 = 0x20;
      do {
        VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar5));
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != -0x10);
    }
    obj = &self->target;
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (((pAVar4 != (AActor *)0x0) &&
        (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), 0 < pAVar4->health)) &&
       (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), ((pAVar4->flags).Value & 4) != 0)) {
      FaceMovementDirection(self);
      self->reactiontime = 0;
      if ((self->MeleeState == (FState *)0x0) || (bVar2 = AActor::CheckMeleeRange(self), !bVar2)) {
        if ((self->MissileState == (FState *)0x0) || (bVar2 = P_CheckMissileRange(self), !bVar2)) {
          bVar2 = P_Move(self);
          if (!bVar2) {
            P_NewChaseDir(self);
            FaceMovementDirection(self);
          }
          iVar3 = FRandom::operator()(&pr_minotaurchase);
          if (5 < iVar3) {
            return 0;
          }
          AActor::PlayActiveSound(self);
          return 0;
        }
        newstate = self->MissileState;
      }
      else {
        iVar3 = (self->AttackSound).super_FSoundID.ID;
        if (iVar3 != 0) {
          local_68.ID = iVar3;
          S_Sound(self,1,&local_68,1.0,1.0);
        }
        newstate = self->MeleeState;
      }
      AActor::SetState(self,newstate,false);
      return 0;
    }
    AActor::SetIdle(self,false);
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_00547be9:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x234,"int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurChase)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		A_Chase (stack, self);
		return 0;
	}

	AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

	// In case pain caused him to skip his fade in.
	self1->RenderStyle = STYLE_Normal;

	if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
	{
		P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
		return 0;
	}

	if (pr_minotaurchase() < 30)
		CALL_ACTION(A_MinotaurLook, self1);		// adjust to closest target

	if (!self1->target || (self1->target->health <= 0) ||
		!(self1->target->flags&MF_SHOOTABLE))
	{ // look for a new target
		self1->SetIdle();
		return 0;
	}

	FaceMovementDirection (self1);
	self1->reactiontime = 0;

	// Melee attack
	if (self1->MeleeState && self1->CheckMeleeRange ())
	{
		if (self1->AttackSound)
		{
			S_Sound (self1, CHAN_WEAPON, self1->AttackSound, 1, ATTN_NORM);
		}
		self1->SetState (self1->MeleeState);
		return 0;
	}

	// Missile attack
	if (self1->MissileState && P_CheckMissileRange(self1))
	{
		self1->SetState (self1->MissileState);
		return 0;
	}

	// chase towards target
	if (!P_Move (self1))
	{
		P_NewChaseDir (self1);
		FaceMovementDirection (self1);
	}

	// Active sound
	if (pr_minotaurchase() < 6)
	{
		self1->PlayActiveSound ();
	}
	return 0;
}